

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

void __thiscall
Refal2::CInternalProgramBuilder::processModules
          (CInternalProgramBuilder *this,CModuleDataVector *modules,
          TProcessFunctionPtr processFunction)

{
  unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
  *puVar1;
  long in_RCX;
  pointer puVar2;
  code *pcVar3;
  int iVar4;
  CPreparatoryFunctions *this_00;
  int i;
  int index;
  long *plVar5;
  
  plVar5 = (long *)((long)&this->errors + in_RCX);
  iVar4 = 0;
  for (puVar2 = (modules->
                super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (modules->
                super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    this_00 = &((puVar2->_M_t).
                super___uniq_ptr_impl<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>
                ._M_t.
                super__Tuple_impl<0UL,_Refal2::CModuleData_*,_std::default_delete<Refal2::CModuleData>_>
                .super__Head_base<0UL,_Refal2::CModuleData_*,_false>._M_head_impl)->Functions;
    for (index = 0; index < this_00->size; index = index + 1) {
      pcVar3 = (code *)processFunction;
      if ((processFunction & 1) != 0) {
        pcVar3 = *(code **)(*plVar5 + -1 + processFunction);
      }
      puVar1 = CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::GetData(this_00,index);
      (*pcVar3)(plVar5,(puVar1->_M_t).
                       super___uniq_ptr_impl<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Refal2::CPreparatoryFunction_*,_std::default_delete<Refal2::CPreparatoryFunction>_>
                       .super__Head_base<0UL,_Refal2::CPreparatoryFunction_*,_false>._M_head_impl,
                iVar4);
    }
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void CInternalProgramBuilder::processModules( const CModuleDataVector& modules,
	const TProcessFunctionPtr processFunction )
{
	TRuntimeModuleId currentModuleId = 0;
	for( CModuleDataVector::const_iterator module = modules.begin();
		module != modules.end(); ++module )
	{
		const CPreparatoryFunctions& functions = ( *module )->Functions;
		for( int i = 0; i < functions.Size(); i++ ) {
			( this->*processFunction )( functions.GetData( i ).get(),
				currentModuleId );
		}
		currentModuleId++;
	}
}